

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void dispatch_timed_event(tgestate_t *state)

{
  tgestate_t *in_RDI;
  uint8_t iters;
  timedevent_t *event;
  eventtime_t time;
  eventtime_t *pcounter;
  char local_21;
  timedevent_t *local_20;
  eventtime_t local_11;
  
  local_11 = in_RDI->clock + '\x01';
  if (local_11 == 0x8c) {
    local_11 = '\0';
  }
  in_RDI->clock = local_11;
  local_20 = dispatch_timed_event::timed_events;
  local_21 = '\x0f';
  do {
    if (local_11 == local_20->time) {
      (*local_20->handler)(in_RDI);
      return;
    }
    local_20 = local_20 + 1;
    local_21 = local_21 + -1;
  } while (local_21 != '\0');
  return;
}

Assistant:

void dispatch_timed_event(tgestate_t *state)
{
  /**
   * $A173: Timed events.
   */
  static const timedevent_t timed_events[15] =
  {
    {   0, &event_another_day_dawns    },
    {   8, &event_wake_up              },
    {  12, &event_new_red_cross_parcel },
    {  16, &event_go_to_roll_call      },
    {  20, &event_roll_call            },
    {  21, &event_go_to_breakfast_time },
    {  36, &event_end_of_breakfast     },
    {  46, &event_go_to_exercise_time  },
    {  64, &event_exercise_time        },
    {  74, &event_go_to_roll_call      },
    {  78, &event_roll_call            },
    {  79, &event_go_to_time_for_bed   },
    {  98, &event_time_for_bed         },
    { 100, &event_night_time           },
    { 130, &event_search_light         },
  };

  eventtime_t        *pcounter; /* was HL */
  eventtime_t         time;     /* was A */
  const timedevent_t *event;    /* was HL */
  uint8_t             iters;    /* was B */

  assert(state != NULL);

  /* Increment the clock, wrapping at 140. */
  pcounter = &state->clock;
  time = *pcounter + 1;
  if (time == 140) // hoist 140 out to time_MAX or somesuch
    time = 0;
  *pcounter = time;

  /* Dispatch the event for that time. */
  event = &timed_events[0];
  iters = NELEMS(timed_events);
  do
  {
    if (time == event->time)
      goto found; // in future rewrite to avoid the goto
    event++;
  }
  while (--iters);

  return;

found:
  event->handler(state);
}